

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendar.cpp
# Opt level: O0

qint64 __thiscall
QCalendarBackend::matchCenturyToWeekday(QCalendarBackend *this,YearMonthDay *parts,int dow)

{
  long lVar1;
  bool bVar2;
  longlong *plVar3;
  longlong lVar4;
  undefined8 *in_RSI;
  long in_FS_OFFSET;
  int offset;
  anon_class_24_3_f321b97e checkOffset;
  optional<long_long> jd_1;
  optional<long_long> jd;
  int local_60;
  undefined8 in_stack_ffffffffffffffb8;
  anon_class_24_3_f321b97e *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (anon_class_24_3_f321b97e *)*in_RSI;
  local_60 = 0;
  do {
    if (0xe < local_60) {
      lVar4 = std::numeric_limits<long_long>::min();
LAB_0055f1ae:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return lVar4;
    }
    matchCenturyToWeekday::anon_class_24_3_f321b97e::operator()
              (this_00,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    bVar2 = std::optional::operator_cast_to_bool((optional<long_long> *)0x55f11a);
    if (bVar2) {
      plVar3 = std::optional<long_long>::operator*((optional<long_long> *)0x55f12a);
      lVar4 = *plVar3;
      goto LAB_0055f1ae;
    }
    if (local_60 != 0) {
      matchCenturyToWeekday::anon_class_24_3_f321b97e::operator()
                (this_00,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      bVar2 = std::optional::operator_cast_to_bool((optional<long_long> *)0x55f176);
      if (bVar2) {
        plVar3 = std::optional<long_long>::operator*((optional<long_long> *)0x55f186);
        lVar4 = *plVar3;
        goto LAB_0055f1ae;
      }
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

qint64 QCalendarBackend::matchCenturyToWeekday(const QCalendar::YearMonthDay &parts, int dow) const
{
    Q_ASSERT(parts.isValid());
    // Brute-force solution as fall-back.
    const auto checkOffset = [parts, dow, this](int centuries) -> std::optional<qint64> {
        // Offset parts.year by the given number of centuries:
        int year = parts.year + centuries * 100;
        // but take into account the effect of crossing zero, if we did:
        if (!hasYearZero() && (parts.year > 0) != (year > 0))
            year += parts.year > 0 ? -1 : +1;
        qint64 jd;
        if (isDateValid(year, parts.month, parts.day)
            && dateToJulianDay(year, parts.month, parts.day, &jd)
            && dayOfWeek(jd) == dow) {
            return jd;
        }
        return std::nullopt;
    };
    // Empirically, aside from Gregorian, each calendar finds every dow within
    // any 29-century run, so 14 centuries is the biggest offset we ever need.
    for (int offset = 0; offset < 15; ++offset) {
        if (auto jd = checkOffset(offset))
            return *jd;
        if (offset) {
            if (auto jd = checkOffset(-offset))
                return *jd;
        }
    }
    return (std::numeric_limits<qint64>::min)();
}